

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int get_lvalue(JSParseState *s,int *popcode,int *pscope,JSAtom *pname,int *plabel,int *pdepth,
              BOOL keep,int tok)

{
  byte bVar1;
  JSFunctionDef *pJVar2;
  uint8_t *puVar3;
  uint32_t val;
  size_t sVar4;
  uint16_t val_00;
  char *fmt;
  uint uVar5;
  int iVar6;
  uint uVar7;
  JSAtom name;
  
  pJVar2 = s->cur_func;
  sVar4 = (size_t)pJVar2->last_opcode_pos;
  if ((long)sVar4 < 0) goto LAB_0014a784;
  puVar3 = (pJVar2->byte_code).buf;
  bVar1 = puVar3[sVar4];
  uVar7 = (uint)bVar1;
  if (bVar1 == 0x41) {
    name = *(JSAtom *)(puVar3 + sVar4 + 1);
    iVar6 = 1;
    uVar5 = 0;
  }
  else {
    iVar6 = 2;
    if (bVar1 != 0x47) {
      if (bVar1 != 0x4a) {
        if (bVar1 == 0xbc) {
          name = *(JSAtom *)(puVar3 + sVar4 + 1);
          uVar5 = (uint)*(ushort *)(puVar3 + sVar4 + 5);
          iVar6 = 1;
          goto LAB_0014a7f5;
        }
        if ((bVar1 != 0xb6) || (name = *(JSAtom *)(puVar3 + sVar4 + 1), name == 8)) {
LAB_0014a784:
          if (tok == -0x45) {
            fmt = "invalid for in/of left hand-side";
          }
          else if ((tok & 0xfffffffeU) == 0xffffff94) {
            fmt = "invalid increment/decrement operand";
          }
          else if ((tok & 0xffffffdfU) == 0x5b) {
            fmt = "invalid destructuring target";
          }
          else {
            fmt = "invalid assignment left-hand side";
          }
LAB_0014a944:
          js_parse_error(s,fmt);
          return -1;
        }
        uVar5 = (uint)*(ushort *)(puVar3 + sVar4 + 5);
        if (name != 0x3a) {
          if (name == 0x71) goto LAB_0014a784;
          if (name != 0x4d) goto LAB_0014a7f5;
        }
        if ((pJVar2->js_mode & 1) != 0) {
          fmt = "invalid lvalue in strict mode";
          goto LAB_0014a944;
        }
        goto LAB_0014a7f5;
      }
      iVar6 = 3;
    }
    uVar5 = 0;
    name = 0;
  }
LAB_0014a7f5:
  (pJVar2->byte_code).size = sVar4;
  pJVar2->last_opcode_pos = -1;
  val_00 = (uint16_t)uVar5;
  if (keep == 0) {
    val = 0xffffffff;
    if (bVar1 == 0x47) {
      emit_op(s,'q');
      uVar7 = 0x47;
    }
    else if (bVar1 == 0x4a) {
      emit_op(s,'p');
      uVar7 = 0x4a;
    }
    else if (bVar1 == 0xb6) {
      val = new_label(s);
      emit_op(s,0xb9);
      emit_atom(s,name);
      emit_u32(s,val);
      emit_u16(s,val_00);
      pJVar2->label_slots[(int)val].ref_count = pJVar2->label_slots[(int)val].ref_count + 1;
      uVar7 = 0x3c;
    }
  }
  else if (bVar1 == 0x41) {
    emit_op(s,'B');
    emit_atom(s,name);
    val = 0xffffffff;
    uVar7 = 0x41;
  }
  else {
    if (bVar1 == 0x47) {
      emit_op(s,'q');
      emit_op(s,'\x13');
      uVar7 = 0x47;
    }
    else {
      if (bVar1 != 0x4a) {
        if (bVar1 == 0xbc) {
          emit_op(s,0xbd);
          emit_atom(s,name);
          emit_u16(s,val_00);
          val = 0xffffffff;
          uVar7 = 0xbc;
        }
        else {
          if (bVar1 != 0xb6) {
            abort();
          }
          val = new_label(s);
          emit_op(s,0xb9);
          emit_atom(s,name);
          emit_u32(s,val);
          emit_u16(s,val_00);
          pJVar2->label_slots[(int)val].ref_count = pJVar2->label_slots[(int)val].ref_count + 1;
          uVar7 = 0x3c;
          emit_op(s,'<');
        }
        goto LAB_0014aa06;
      }
      emit_op(s,'p');
      emit_op(s,'\x14');
      uVar7 = 0x4a;
    }
    emit_op(s,(uint8_t)uVar7);
    val = 0xffffffff;
  }
LAB_0014aa06:
  *popcode = uVar7;
  *pscope = uVar5;
  *pname = name;
  *plabel = val;
  if (pdepth != (int *)0x0) {
    *pdepth = iVar6;
  }
  return 0;
}

Assistant:

static __exception int get_lvalue(JSParseState *s, int *popcode, int *pscope,
                                  JSAtom *pname, int *plabel, int *pdepth, BOOL keep,
                                  int tok)
{
    JSFunctionDef *fd;
    int opcode, scope, label, depth;
    JSAtom name;

    /* we check the last opcode to get the lvalue type */
    fd = s->cur_func;
    scope = 0;
    name = JS_ATOM_NULL;
    label = -1;
    depth = 0;
    switch(opcode = get_prev_opcode(fd)) {
    case OP_scope_get_var:
        name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        scope = get_u16(fd->byte_code.buf + fd->last_opcode_pos + 5);
        if ((name == JS_ATOM_arguments || name == JS_ATOM_eval) &&
            (fd->js_mode & JS_MODE_STRICT)) {
            return js_parse_error(s, "invalid lvalue in strict mode");
        }
        if (name == JS_ATOM_this || name == JS_ATOM_new_target)
            goto invalid_lvalue;
        depth = 2;  /* will generate OP_get_ref_value */
        break;
    case OP_get_field:
        name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        depth = 1;
        break;
    case OP_scope_get_private_field:
        name = get_u32(fd->byte_code.buf + fd->last_opcode_pos + 1);
        scope = get_u16(fd->byte_code.buf + fd->last_opcode_pos + 5);
        depth = 1;
        break;
    case OP_get_array_el:
        depth = 2;
        break;
    case OP_get_super_value:
        depth = 3;
        break;
    default:
    invalid_lvalue:
        if (tok == TOK_FOR) {
            return js_parse_error(s, "invalid for in/of left hand-side");
        } else if (tok == TOK_INC || tok == TOK_DEC) {
            return js_parse_error(s, "invalid increment/decrement operand");
        } else if (tok == '[' || tok == '{') {
            return js_parse_error(s, "invalid destructuring target");
        } else {
            return js_parse_error(s, "invalid assignment left-hand side");
        }
    }
    /* remove the last opcode */
    fd->byte_code.size = fd->last_opcode_pos;
    fd->last_opcode_pos = -1;

    if (keep) {
        /* get the value but keep the object/fields on the stack */
        switch(opcode) {
        case OP_scope_get_var:
            label = new_label(s);
            emit_op(s, OP_scope_make_ref);
            emit_atom(s, name);
            emit_u32(s, label);
            emit_u16(s, scope);
            update_label(fd, label, 1);
            emit_op(s, OP_get_ref_value);
            opcode = OP_get_ref_value;
            break;
        case OP_get_field:
            emit_op(s, OP_get_field2);
            emit_atom(s, name);
            break;
        case OP_scope_get_private_field:
            emit_op(s, OP_scope_get_private_field2);
            emit_atom(s, name);
            emit_u16(s, scope);
            break;
        case OP_get_array_el:
            /* XXX: replace by a single opcode ? */
            emit_op(s, OP_to_propkey2);
            emit_op(s, OP_dup2);
            emit_op(s, OP_get_array_el);
            break;
        case OP_get_super_value:
            emit_op(s, OP_to_propkey);
            emit_op(s, OP_dup3);
            emit_op(s, OP_get_super_value);
            break;
        default:
            abort();
        }
    } else {
        switch(opcode) {
        case OP_scope_get_var:
            label = new_label(s);
            emit_op(s, OP_scope_make_ref);
            emit_atom(s, name);
            emit_u32(s, label);
            emit_u16(s, scope);
            update_label(fd, label, 1);
            opcode = OP_get_ref_value;
            break;
        case OP_get_array_el:
            emit_op(s, OP_to_propkey2);
            break;
        case OP_get_super_value:
            emit_op(s, OP_to_propkey);
            break;
        }
    }

    *popcode = opcode;
    *pscope = scope;
    /* name has refcount for OP_get_field and OP_get_ref_value,
       and JS_ATOM_NULL for other opcodes */
    *pname = name;
    *plabel = label;
    if (pdepth)
        *pdepth = depth;
    return 0;
}